

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeParameters.cpp
# Opt level: O2

void __thiscall
OpenMD::FluctuatingChargeParameters::FluctuatingChargeParameters(FluctuatingChargeParameters *this)

{
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ParamMap *this_01;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_c1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_a0;
  ParameterBase *local_78;
  ParameterBase *local_70;
  ParameterBase *local_68;
  ParameterBase *local_60;
  ParameterBase *local_58;
  ParameterBase *local_50;
  ParameterBase *local_48;
  ParameterBase *local_40;
  ParameterBase *local_38;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder =
       (_func_int **)&PTR__FluctuatingChargeParameters_002bfba0;
  this_00 = &this->Propagator;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(this_00);
  local_38 = &(this->DoInitialOptimization).super_ParameterBase;
  (this->DoInitialOptimization).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->DoInitialOptimization).super_ParameterBase.keyword_.field_2;
  (this->DoInitialOptimization).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DoInitialOptimization).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DoInitialOptimization).super_ParameterBase.optional_ = false;
  (this->DoInitialOptimization).super_ParameterBase.defaultValue_ = false;
  (this->DoInitialOptimization).super_ParameterBase.empty_ = true;
  (this->DoInitialOptimization).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bfbe0;
  this_02 = &this->ChargeOptimizationMethod;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(this_02);
  (this->Friction).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Friction).super_ParameterBase.keyword_.field_2;
  (this->Friction).super_ParameterBase.keyword_._M_string_length = 0;
  local_40 = &(this->Friction).super_ParameterBase;
  (this->Friction).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Friction).super_ParameterBase.optional_ = false;
  (this->Friction).super_ParameterBase.defaultValue_ = false;
  (this->Friction).super_ParameterBase.empty_ = true;
  (this->Friction).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bfc58;
  (this->Tolerance).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Tolerance).super_ParameterBase.keyword_.field_2;
  (this->Tolerance).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Tolerance).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Tolerance).super_ParameterBase.optional_ = false;
  (this->Tolerance).super_ParameterBase.defaultValue_ = false;
  local_48 = &(this->Tolerance).super_ParameterBase;
  (this->Tolerance).super_ParameterBase.empty_ = true;
  (this->Tolerance).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bfc58;
  (this->MaxIterations).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MaxIterations).super_ParameterBase.keyword_.field_2;
  (this->MaxIterations).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MaxIterations).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MaxIterations).super_ParameterBase.optional_ = false;
  (this->MaxIterations).super_ParameterBase.defaultValue_ = false;
  (this->MaxIterations).super_ParameterBase.empty_ = true;
  (this->MaxIterations).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bfcd0;
  (this->TargetTemp).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->TargetTemp).super_ParameterBase.keyword_.field_2;
  (this->TargetTemp).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TargetTemp).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TargetTemp).super_ParameterBase.optional_ = false;
  (this->TargetTemp).super_ParameterBase.defaultValue_ = false;
  local_50 = &(this->MaxIterations).super_ParameterBase;
  (this->TargetTemp).super_ParameterBase.empty_ = true;
  (this->TargetTemp).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bfc58;
  (this->TauThermostat).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->TauThermostat).super_ParameterBase.keyword_.field_2;
  (this->TauThermostat).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TauThermostat).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TauThermostat).super_ParameterBase.optional_ = false;
  (this->TauThermostat).super_ParameterBase.defaultValue_ = false;
  local_58 = &(this->TargetTemp).super_ParameterBase;
  (this->TauThermostat).super_ParameterBase.empty_ = true;
  (this->TauThermostat).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bfc58;
  (this->DragCoefficient).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->DragCoefficient).super_ParameterBase.keyword_.field_2;
  (this->DragCoefficient).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DragCoefficient).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DragCoefficient).super_ParameterBase.optional_ = false;
  (this->DragCoefficient).super_ParameterBase.defaultValue_ = false;
  local_60 = &(this->TauThermostat).super_ParameterBase;
  (this->DragCoefficient).super_ParameterBase.empty_ = true;
  (this->DragCoefficient).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bfc58;
  (this->ConstrainRegions).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ConstrainRegions).super_ParameterBase.keyword_.field_2;
  (this->ConstrainRegions).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ConstrainRegions).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ConstrainRegions).super_ParameterBase.optional_ = false;
  (this->ConstrainRegions).super_ParameterBase.defaultValue_ = false;
  local_68 = &(this->DragCoefficient).super_ParameterBase;
  (this->ConstrainRegions).super_ParameterBase.empty_ = true;
  (this->ConstrainRegions).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bfbe0;
  (this->InitialStepSize).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->InitialStepSize).super_ParameterBase.keyword_.field_2;
  (this->InitialStepSize).super_ParameterBase.keyword_._M_string_length = 0;
  (this->InitialStepSize).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->InitialStepSize).super_ParameterBase.optional_ = false;
  (this->InitialStepSize).super_ParameterBase.defaultValue_ = false;
  local_70 = &(this->ConstrainRegions).super_ParameterBase;
  local_78 = &(this->InitialStepSize).super_ParameterBase;
  (this->InitialStepSize).super_ParameterBase.empty_ = true;
  (this->InitialStepSize).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bfc58;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"propagator",(allocator<char> *)&local_c0);
  std::__cxx11::string::_M_assign((string *)&(this->Propagator).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->Propagator).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Damped",(allocator<char> *)&local_c0);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(this_00,&local_a0.first);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"propagator",&local_c1);
  local_a0.first._M_string_length = local_b8;
  this_01 = &(this->super_DataHolder).parameters_;
  paVar1 = &local_a0.first.field_2;
  if (local_c0 == &local_b0) {
    local_a0.first.field_2._8_8_ = local_b0._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_c0;
  }
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_c0 = &local_b0;
  local_a0.second = &this_00->super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"doInitialOptimization",(allocator<char> *)&local_c0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->DoInitialOptimization).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->DoInitialOptimization).super_ParameterBase.optional_ = true;
  (this->DoInitialOptimization).super_ParameterBase.defaultValue_ = true;
  (this->DoInitialOptimization).super_ParameterBase.empty_ = false;
  (this->DoInitialOptimization).super_ParameterBase.field_0x2b = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"doInitialOptimization",&local_c1);
  local_a0.first._M_string_length = local_b8;
  if (local_c0 == &local_b0) {
    local_a0.first.field_2._8_8_ = local_b0._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_c0;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0.second = local_38;
  local_c0 = &local_b0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"method",(allocator<char> *)&local_c0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->ChargeOptimizationMethod).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->ChargeOptimizationMethod).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"CG",(allocator<char> *)&local_c0);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(this_02,&local_a0.first);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"method",&local_c1);
  local_a0.first._M_string_length = local_b8;
  if (local_c0 == &local_b0) {
    local_a0.first.field_2._8_8_ = local_b0._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_c0;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_c0 = &local_b0;
  local_a0.second = &this_02->super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"friction",(allocator<char> *)&local_c0);
  std::__cxx11::string::_M_assign((string *)&(this->Friction).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->Friction).super_ParameterBase.optional_ = true;
  (this->Friction).super_ParameterBase.defaultValue_ = true;
  (this->Friction).data_ = 1600.0;
  (this->Friction).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"friction",&local_c1);
  local_a0.first._M_string_length = local_b8;
  if (local_c0 == &local_b0) {
    local_a0.first.field_2._8_8_ = local_b0._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_c0;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0.second = local_40;
  local_c0 = &local_b0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"tolerance",(allocator<char> *)&local_c0);
  std::__cxx11::string::_M_assign((string *)&(this->Tolerance).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->Tolerance).super_ParameterBase.optional_ = true;
  (this->Tolerance).super_ParameterBase.defaultValue_ = true;
  (this->Tolerance).data_ = 1e-05;
  (this->Tolerance).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"tolerance",&local_c1);
  local_a0.first._M_string_length = local_b8;
  if (local_c0 == &local_b0) {
    local_a0.first.field_2._8_8_ = local_b0._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_c0;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0.second = local_48;
  local_c0 = &local_b0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"maxIterations",(allocator<char> *)&local_c0);
  std::__cxx11::string::_M_assign((string *)&(this->MaxIterations).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->MaxIterations).super_ParameterBase.optional_ = true;
  (this->MaxIterations).super_ParameterBase.defaultValue_ = true;
  *(undefined4 *)&(this->MaxIterations).super_ParameterBase.field_0x2c = 100;
  (this->MaxIterations).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"maxIterations",&local_c1);
  local_a0.first._M_string_length = local_b8;
  if (local_c0 == &local_b0) {
    local_a0.first.field_2._8_8_ = local_b0._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_c0;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0.second = local_50;
  local_c0 = &local_b0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"targetTemp",(allocator<char> *)&local_c0);
  std::__cxx11::string::_M_assign((string *)&(this->TargetTemp).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->TargetTemp).super_ParameterBase.optional_ = true;
  (this->TargetTemp).super_ParameterBase.defaultValue_ = true;
  (this->TargetTemp).data_ = 1e-06;
  (this->TargetTemp).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"targetTemp",&local_c1);
  local_a0.first._M_string_length = local_b8;
  if (local_c0 == &local_b0) {
    local_a0.first.field_2._8_8_ = local_b0._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_c0;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0.second = local_58;
  local_c0 = &local_b0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"tauThermostat",(allocator<char> *)&local_c0);
  std::__cxx11::string::_M_assign((string *)&(this->TauThermostat).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->TauThermostat).super_ParameterBase.optional_ = true;
  (this->TauThermostat).super_ParameterBase.defaultValue_ = true;
  (this->TauThermostat).data_ = 10.0;
  (this->TauThermostat).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"tauThermostat",&local_c1);
  local_a0.first._M_string_length = local_b8;
  if (local_c0 == &local_b0) {
    local_a0.first.field_2._8_8_ = local_b0._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_c0;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0.second = local_60;
  local_c0 = &local_b0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"dragCoefficient",(allocator<char> *)&local_c0);
  std::__cxx11::string::_M_assign((string *)&(this->DragCoefficient).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->DragCoefficient).super_ParameterBase.optional_ = true;
  (this->DragCoefficient).super_ParameterBase.defaultValue_ = true;
  (this->DragCoefficient).data_ = 0.01;
  (this->DragCoefficient).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"dragCoefficient",&local_c1);
  local_a0.first._M_string_length = local_b8;
  if (local_c0 == &local_b0) {
    local_a0.first.field_2._8_8_ = local_b0._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_c0;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0.second = local_68;
  local_c0 = &local_b0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"constrainRegions",(allocator<char> *)&local_c0);
  std::__cxx11::string::_M_assign((string *)&(this->ConstrainRegions).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->ConstrainRegions).super_ParameterBase.optional_ = true;
  (this->ConstrainRegions).super_ParameterBase.defaultValue_ = true;
  (this->ConstrainRegions).super_ParameterBase.empty_ = false;
  (this->ConstrainRegions).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"constrainRegions",&local_c1);
  local_a0.first._M_string_length = local_b8;
  if (local_c0 == &local_b0) {
    local_a0.first.field_2._8_8_ = local_b0._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_c0;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0.second = local_70;
  local_c0 = &local_b0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"initialStepSize",(allocator<char> *)&local_c0);
  std::__cxx11::string::_M_assign((string *)&(this->InitialStepSize).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->InitialStepSize).super_ParameterBase.optional_ = true;
  (this->InitialStepSize).super_ParameterBase.defaultValue_ = true;
  (this->InitialStepSize).data_ = 0.1;
  (this->InitialStepSize).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"initialStepSize",&local_c1);
  local_a0.first._M_string_length = local_b8;
  if (local_c0 == &local_b0) {
    local_a0.first.field_2._8_8_ = local_b0._8_8_;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.first._M_dataplus._M_p = (pointer)local_c0;
  }
  local_a0.first.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_a0.first.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0.second = local_78;
  local_c0 = &local_b0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

FluctuatingChargeParameters::FluctuatingChargeParameters() {
    DefineOptionalParameterWithDefaultValue(Propagator, "propagator", "Damped");
    DefineOptionalParameterWithDefaultValue(DoInitialOptimization,
                                            "doInitialOptimization", true);
    DefineOptionalParameterWithDefaultValue(ChargeOptimizationMethod, "method",
                                            "CG");
    DefineOptionalParameterWithDefaultValue(Friction, "friction", 1600.0);
    DefineOptionalParameterWithDefaultValue(Tolerance, "tolerance", 1.0e-5);
    DefineOptionalParameterWithDefaultValue(MaxIterations, "maxIterations",
                                            100);
    DefineOptionalParameterWithDefaultValue(TargetTemp, "targetTemp", 1.0e-6);
    DefineOptionalParameterWithDefaultValue(TauThermostat, "tauThermostat",
                                            10.0);
    DefineOptionalParameterWithDefaultValue(DragCoefficient, "dragCoefficient",
                                            0.01);
    DefineOptionalParameterWithDefaultValue(ConstrainRegions,
                                            "constrainRegions", false);
    DefineOptionalParameterWithDefaultValue(InitialStepSize, "initialStepSize",
                                            0.1);
  }